

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_mmod(uECC_word_t *result,uECC_word_t *product,uECC_word_t *mod,wordcount_t num_words)

{
  wordcount_t num_words_00;
  byte bVar1;
  bitcount_t bVar2;
  ulong uVar3;
  uECC_word_t auStack_468 [113];
  uECC_word_t diff;
  long lStack_d8;
  wordcount_t i;
  uECC_word_t borrow;
  uECC_word_t carry;
  wordcount_t bit_shift;
  wordcount_t word_shift;
  ulong uStack_c0;
  bitcount_t shift;
  uECC_word_t index;
  uECC_word_t *v [2];
  uECC_word_t tmp [8];
  uECC_word_t mod_multiple [8];
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *product_local;
  uECC_word_t *result_local;
  
  v[0] = product;
  bVar2 = uECC_vli_numBits(mod,num_words);
  carry._6_2_ = num_words * 0x80 - bVar2;
  num_words_00 = (wordcount_t)((int)carry._6_2_ / 0x40);
  bVar1 = (byte)((int)carry._6_2_ % 0x40);
  borrow = 0;
  uECC_vli_clear(tmp + 7,num_words_00);
  if ((char)bVar1 < '\x01') {
    uECC_vli_set(tmp + (long)(int)num_words_00 + 7,mod,num_words);
  }
  else {
    for (uStack_c0 = 0; uStack_c0 < (ulong)(long)num_words; uStack_c0 = uStack_c0 + 1) {
      tmp[(long)num_words_00 + uStack_c0 + 7] = mod[uStack_c0] << (bVar1 & 0x3f) | borrow;
      borrow = mod[uStack_c0] >> (0x40 - bVar1 & 0x3f);
    }
  }
  uStack_c0 = 1;
  for (; -1 < carry._6_2_; carry._6_2_ = carry._6_2_ + -1) {
    lStack_d8 = 0;
    for (diff._7_1_ = '\0';
        SBORROW4((int)diff._7_1_,num_words * 2) != (int)diff._7_1_ + num_words * -2 < 0;
        diff._7_1_ = diff._7_1_ + '\x01') {
      uVar3 = (v[uStack_c0 + -1][diff._7_1_] - tmp[(long)diff._7_1_ + 7]) - lStack_d8;
      if (uVar3 != v[uStack_c0 + -1][diff._7_1_]) {
        lStack_d8 = (long)(int)(uint)(v[uStack_c0 + -1][diff._7_1_] < uVar3);
      }
      v[-uStack_c0][diff._7_1_] = uVar3;
    }
    uStack_c0 = (ulong)(int)(uint)((uStack_c0 != lStack_d8 ^ 0xffU) & 1);
    uECC_vli_rshift1(tmp + 7,num_words);
    tmp[(long)(num_words + -1) + 7] =
         tmp[(long)num_words + 7] << 0x3f | tmp[(long)(num_words + -1) + 7];
    uECC_vli_rshift1(tmp + (long)(int)num_words + 7,num_words);
  }
  uECC_vli_set(result,v[uStack_c0 + -1],num_words);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_mmod(uECC_word_t *result,
                                uECC_word_t *product,
                                const uECC_word_t *mod,
                                wordcount_t num_words) {
    uECC_word_t mod_multiple[2 * uECC_MAX_WORDS];
    uECC_word_t tmp[2 * uECC_MAX_WORDS];
    uECC_word_t *v[2] = {tmp, product};
    uECC_word_t index;

    /* Shift mod so its highest set bit is at the maximum position. */
    bitcount_t shift = (num_words * 2 * uECC_WORD_BITS) - uECC_vli_numBits(mod, num_words);
    wordcount_t word_shift = shift / uECC_WORD_BITS;
    wordcount_t bit_shift = shift % uECC_WORD_BITS;
    uECC_word_t carry = 0;
    uECC_vli_clear(mod_multiple, word_shift);
    if (bit_shift > 0) {
        for(index = 0; index < (uECC_word_t)num_words; ++index) {
            mod_multiple[word_shift + index] = (mod[index] << bit_shift) | carry;
            carry = mod[index] >> (uECC_WORD_BITS - bit_shift);
        }
    } else {
        uECC_vli_set(mod_multiple + word_shift, mod, num_words);
    }

    for (index = 1; shift >= 0; --shift) {
        uECC_word_t borrow = 0;
        wordcount_t i;
        for (i = 0; i < num_words * 2; ++i) {
            uECC_word_t diff = v[index][i] - mod_multiple[i] - borrow;
            if (diff != v[index][i]) {
                borrow = (diff > v[index][i]);
            }
            v[1 - index][i] = diff;
        }
        index = !(index ^ borrow); /* Swap the index if there was no borrow */
        uECC_vli_rshift1(mod_multiple, num_words);
        mod_multiple[num_words - 1] |= mod_multiple[num_words] << (uECC_WORD_BITS - 1);
        uECC_vli_rshift1(mod_multiple + num_words, num_words);
    }
    uECC_vli_set(result, v[index], num_words);
}